

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O1

int av1_calc_iframe_target_size_one_pass_cbr(AV1_COMP *cpi)

{
  double dVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  byte bVar6;
  int iVar7;
  long lVar8;
  double dVar9;
  
  if ((cpi->common).current_frame.frame_number == 0) {
    lVar5 = (cpi->ppi->p_rc).starting_buffer_level;
    lVar8 = 0x7fffffff;
    if (lVar5 < 0x100000000) {
      lVar8 = (long)(int)((ulong)(lVar5 - (lVar5 >> 0x3f)) >> 1);
    }
    iVar7 = (cpi->svc).number_temporal_layers;
    if ((1 < iVar7) && (lVar8 < 0x1fffffff)) {
      bVar6 = 2;
      if (iVar7 < 4) {
        bVar6 = (char)iVar7 - 1;
      }
      lVar8 = lVar8 << (bVar6 & 0x3f);
    }
  }
  else {
    dVar1 = cpi->framerate;
    dVar9 = round(dVar1 + dVar1 + -16.0);
    iVar7 = 0x20;
    if (0x20 < (int)dVar9) {
      iVar7 = (int)dVar9;
    }
    iVar2 = (cpi->rc).frames_since_key;
    iVar3 = (int)((double)(iVar2 * iVar7) / (dVar1 * 0.5));
    if (dVar1 * 0.5 <= (double)iVar2) {
      iVar3 = iVar7;
    }
    lVar8 = (long)(cpi->rc).avg_frame_bandwidth * (long)(iVar3 + 0x10) >> 4;
  }
  uVar4 = (ulong)(cpi->oxcf).rc_cfg.max_intra_bitrate_pct;
  if (uVar4 != 0) {
    lVar5 = (long)((long)(cpi->rc).avg_frame_bandwidth * uVar4) / 100;
    if (lVar5 < lVar8) {
      lVar8 = lVar5;
    }
  }
  lVar5 = (long)(cpi->rc).max_frame_bandwidth;
  if (lVar8 < lVar5) {
    lVar5 = lVar8;
  }
  return (int)lVar5;
}

Assistant:

int av1_calc_iframe_target_size_one_pass_cbr(const AV1_COMP *cpi) {
  const RATE_CONTROL *rc = &cpi->rc;
  const PRIMARY_RATE_CONTROL *p_rc = &cpi->ppi->p_rc;
  int64_t target;
  if (cpi->common.current_frame.frame_number == 0) {
    target = ((p_rc->starting_buffer_level / 2) > INT_MAX)
                 ? INT_MAX
                 : (int)(p_rc->starting_buffer_level / 2);
    if (cpi->svc.number_temporal_layers > 1 && target < (INT_MAX >> 2)) {
      target = target << AOMMIN(2, (cpi->svc.number_temporal_layers - 1));
    }
  } else {
    int kf_boost = 32;
    double framerate = cpi->framerate;

    kf_boost = AOMMAX(kf_boost, (int)round(2 * framerate - 16));
    if (rc->frames_since_key < framerate / 2) {
      kf_boost = (int)(kf_boost * rc->frames_since_key / (framerate / 2));
    }
    target = ((int64_t)(16 + kf_boost) * rc->avg_frame_bandwidth) >> 4;
  }
  return clamp_iframe_target_size(cpi, target);
}